

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase103::run(TestCase103 *this)

{
  Builder builder_00;
  Reader reader;
  SegmentBuilder *pSVar1;
  Builder root;
  undefined1 in_stack_00000080 [48];
  MallocMessageBuilder builder;
  Builder in_stack_00000220;
  SegmentBuilder *local_1a8;
  StructBuilder SStack_1a0;
  SegmentBuilder *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  Builder local_140 [2];
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(local_140,&local_108.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_1a8,
             (EVP_PKEY_CTX *)(schemas::s_a851ad32cbc2ffea + 0x48));
  initDynamicTestLists(in_stack_00000220);
  pSVar1 = local_1a8;
  StructBuilder::asReader(&SStack_1a0);
  local_140[0].builder.segment = pSVar1;
  Schema::requireUsableAs((Schema *)local_140,(RawSchema *)schemas::s_a851ad32cbc2ffea);
  checkTestMessage((Reader)in_stack_00000080);
  pSVar1 = local_1a8;
  StructBuilder::asReader(&SStack_1a0);
  local_178 = pSVar1;
  reader.reader.segment = (SegmentReader *)uStack_170;
  reader.schema.super_Schema.raw = (Schema)(Schema)pSVar1;
  reader.reader.capTable = (CapTableReader *)local_168;
  reader.reader.data = (void *)uStack_160;
  reader.reader.pointers = (WirePointer *)local_158;
  reader.reader.dataSize = (undefined4)uStack_150;
  reader.reader.pointerCount = uStack_150._4_2_;
  reader.reader._38_2_ = uStack_150._6_2_;
  reader.reader._40_8_ = local_148;
  checkDynamicTestLists(reader);
  builder_00.builder.segment = SStack_1a0.segment;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)local_1a8;
  builder_00.builder.capTable = SStack_1a0.capTable;
  builder_00.builder.data = SStack_1a0.data;
  builder_00.builder.pointers = SStack_1a0.pointers;
  builder_00.builder.dataSize = SStack_1a0.dataSize;
  builder_00.builder.pointerCount = SStack_1a0.pointerCount;
  builder_00.builder._38_2_ = SStack_1a0._38_2_;
  checkDynamicTestLists(builder_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(DynamicApi, ListListsBuild) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestListDefaults>());

  initDynamicTestLists(root);
  checkTestMessage(root.asReader().as<TestListDefaults>());

  checkDynamicTestLists(root.asReader());
  checkDynamicTestLists(root);
}